

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::BBoxRenderCase::iterate(BBoxRenderCase *this)

{
  TestLog *log;
  pointer pIVar1;
  int iVar2;
  pointer pIVar3;
  ScopedLogSection section;
  ScopedLogSection SStack_188;
  int local_17c;
  int local_178;
  int local_174;
  string local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  std::operator+(&local_50,&local_70,"Iteration");
  local_174 = this->m_iteration;
  de::toString<int>(&local_90,&local_174);
  std::operator+(&local_30,&local_50,&local_90);
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  local_130._M_string_length = 0;
  local_130.field_2._M_local_buf[0] = '\0';
  std::operator+(&local_110,&local_130,"Iteration ");
  local_178 = this->m_iteration + 1;
  de::toString<int>(&local_150,&local_178);
  std::operator+(&local_f0,&local_110,&local_150);
  std::operator+(&local_d0,&local_f0,"/");
  local_17c = (int)((ulong)((long)(this->m_iterationConfigs).
                                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->m_iterationConfigs).
                                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 6);
  de::toString<int>(&local_170,&local_17c);
  std::operator+(&local_b0,&local_d0,&local_170);
  tcu::ScopedLogSection::ScopedLogSection(&SStack_188,log,&local_30,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  pIVar3 = (this->m_iterationConfigs).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>_>
           ._M_impl.super__Vector_impl_data._M_start + this->m_iteration;
  if ((long)this->m_iteration == 0) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0xc])(this,pIVar3);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0xd])(this,pIVar3);
  iVar2 = this->m_iteration + 1;
  this->m_iteration = iVar2;
  pIVar3 = (this->m_iterationConfigs).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pIVar1 = (this->m_iterationConfigs).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>_>
           ._M_impl.super__Vector_impl_data._M_start;
  tcu::ScopedLogSection::~ScopedLogSection(&SStack_188);
  return (IterateResult)(iVar2 < (int)((ulong)((long)pIVar3 - (long)pIVar1) >> 6));
}

Assistant:

BBoxRenderCase::IterateResult BBoxRenderCase::iterate (void)
{
	const tcu::ScopedLogSection	section		(m_testCtx.getLog(),
											 std::string() + "Iteration" + de::toString((int)m_iteration),
											 std::string() + "Iteration " + de::toString((int)m_iteration+1) + "/" + de::toString((int)m_iterationConfigs.size()));
	const IterationConfig&		config		= m_iterationConfigs[m_iteration];

	// default
	if (m_iteration == 0)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	renderTestPattern(config);
	verifyRenderResult(config);

	if (++m_iteration < (int)m_iterationConfigs.size())
		return CONTINUE;

	return STOP;
}